

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O2

int GetSkipHeight(int height)

{
  uint uVar1;
  long in_FS_OFFSET;
  
  uVar1 = 0;
  if (1 < height) {
    if ((height & 1U) == 0) {
      uVar1 = height + 0x7fffffffU & height;
    }
    else {
      uVar1 = height + 0x7ffffffeU & height - 1U;
      uVar1 = uVar1 + 0x7fffffff & uVar1 | 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return uVar1;
  }
  __stack_chk_fail();
}

Assistant:

int static inline GetSkipHeight(int height) {
    if (height < 2)
        return 0;

    // Determine which height to jump back to. Any number strictly lower than height is acceptable,
    // but the following expression seems to perform well in simulations (max 110 steps to go back
    // up to 2**18 blocks).
    return (height & 1) ? InvertLowestOne(InvertLowestOne(height - 1)) + 1 : InvertLowestOne(height);
}